

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physics.cpp
# Opt level: O0

vector<Node,_std::allocator<Node>_> *
generateRandomNodes(vector<Node,_std::allocator<Node>_> *__return_storage_ptr__,size_t n)

{
  float fVar1;
  ulong uVar2;
  reference pvVar3;
  float *pfVar4;
  result_type_conflict1 rVar5;
  result_type_conflict1 local_60;
  float local_5c;
  result_type_conflict1 local_58;
  float local_54;
  ulong local_50;
  size_t i;
  allocator<Node> local_32;
  undefined1 local_31;
  uniform_real_distribution<float> local_30;
  uniform_real_distribution<float> sizeDistribution;
  uniform_real_distribution<float> originDistribution;
  default_random_engine generator;
  size_t n_local;
  vector<Node,_std::allocator<Node>_> *nodes;
  
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             &originDistribution);
  std::uniform_real_distribution<float>::uniform_real_distribution(&sizeDistribution,0.0,1.0);
  std::uniform_real_distribution<float>::uniform_real_distribution(&local_30,0.0,0.01);
  local_31 = 0;
  std::allocator<Node>::allocator(&local_32);
  std::vector<Node,_std::allocator<Node>_>::vector(__return_storage_ptr__,n,&local_32);
  std::allocator<Node>::~allocator(&local_32);
  for (local_50 = 0; local_50 < n; local_50 = local_50 + 1) {
    rVar5 = std::uniform_real_distribution<float>::operator()
                      (&sizeDistribution,
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       &originDistribution);
    pvVar3 = std::vector<Node,_std::allocator<Node>_>::operator[](__return_storage_ptr__,local_50);
    (pvVar3->box).left = rVar5;
    rVar5 = std::uniform_real_distribution<float>::operator()
                      (&sizeDistribution,
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       &originDistribution);
    pvVar3 = std::vector<Node,_std::allocator<Node>_>::operator[](__return_storage_ptr__,local_50);
    (pvVar3->box).top = rVar5;
    pvVar3 = std::vector<Node,_std::allocator<Node>_>::operator[](__return_storage_ptr__,local_50);
    local_54 = 1.0 - (pvVar3->box).left;
    local_58 = std::uniform_real_distribution<float>::operator()
                         (&local_30,
                          (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                          &originDistribution);
    pfVar4 = std::min<float>(&local_54,&local_58);
    fVar1 = *pfVar4;
    pvVar3 = std::vector<Node,_std::allocator<Node>_>::operator[](__return_storage_ptr__,local_50);
    (pvVar3->box).width = fVar1;
    pvVar3 = std::vector<Node,_std::allocator<Node>_>::operator[](__return_storage_ptr__,local_50);
    local_5c = 1.0 - (pvVar3->box).top;
    local_60 = std::uniform_real_distribution<float>::operator()
                         (&local_30,
                          (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                          &originDistribution);
    pfVar4 = std::min<float>(&local_5c,&local_60);
    fVar1 = *pfVar4;
    pvVar3 = std::vector<Node,_std::allocator<Node>_>::operator[](__return_storage_ptr__,local_50);
    uVar2 = local_50;
    (pvVar3->box).height = fVar1;
    pvVar3 = std::vector<Node,_std::allocator<Node>_>::operator[](__return_storage_ptr__,local_50);
    pvVar3->id = uVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Node> generateRandomNodes(std::size_t n)
{
    auto generator = std::default_random_engine();
    auto originDistribution = std::uniform_real_distribution(0.0f, 1.0f);
    auto sizeDistribution = std::uniform_real_distribution(0.0f, 0.01f);
    auto nodes = std::vector<Node>(n);
    for (auto i = std::size_t(0); i < n; ++i)
    {
        nodes[i].box.left = originDistribution(generator);
        nodes[i].box.top = originDistribution(generator);
        nodes[i].box.width = std::min(1.0f - nodes[i].box.left, sizeDistribution(generator));
        nodes[i].box.height = std::min(1.0f - nodes[i].box.top, sizeDistribution(generator));
        nodes[i].id = i;
    }
    return nodes;
}